

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  long lVar1;
  DataReader *pDVar2;
  pointer puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  pointer pcVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  size_t sVar15;
  undefined4 extraout_var_11;
  int *piVar16;
  ulong uVar17;
  char *__format;
  ulong uVar18;
  ulong uVar19;
  size_t __n;
  ulong __new_size;
  Mat local_4b8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  anon_union_4_2_77b30072 flag_struct;
  void *refbuf;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  int local_420;
  Allocator *local_418;
  undefined8 local_410;
  undefined8 uStack_408;
  int local_400;
  size_t local_3f8;
  long lVar14;
  
  local_4b8.cstep = 0;
  local_4b8.data = (pointer)0x0;
  local_4b8.refcount._0_4_ = 0;
  local_4b8.refcount._4_4_ = 0;
  local_4b8.elemsize._0_4_ = 0;
  local_4b8.elemsize._4_4_ = 0;
  local_4b8.elempack = 0;
  local_4b8.allocator = (Allocator *)0x0;
  local_4b8.dims = 0;
  local_4b8.w = 0;
  local_4b8.h = 0;
  local_4b8.d = 0;
  local_4b8.c = 0;
  if (type != 1) {
    if (type == 0) {
      pDVar2 = this->d->dr;
      sVar15 = 4;
      iVar12 = (*pDVar2->_vptr_DataReader[3])(pDVar2,&flag_struct,4);
      lVar14 = CONCAT44(extraout_var,iVar12);
      if (lVar14 == 4) {
        if (flag_struct.tag == 0x2c056) {
          int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pDVar2 = this->d->dr;
          lVar1 = (long)w * 4;
          iVar12 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
          pcVar11 = int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (CONCAT44(extraout_var_04,iVar12) == lVar1) {
            piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (local_4b8.allocator == (Allocator *)0x0) {
                  free(local_4b8.data);
                }
                else {
                  (*(local_4b8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_4b8.data = pcVar11;
            local_4b8.refcount._0_4_ = 0;
            local_4b8.refcount._4_4_ = 0;
            local_4b8.elemsize._0_4_ = 4;
            local_4b8.elemsize._4_4_ = 0;
            local_4b8.elempack = 1;
            local_4b8.allocator = (Allocator *)0x0;
            local_4b8.h = 1;
            local_4b8.d = 1;
            piVar16 = (int *)0x0;
            local_4b8.dims = local_4b8.elempack;
            local_4b8.w = w;
            local_4b8.c = local_4b8.elempack;
            local_4b8.cstep = (long)w;
          }
          else {
            Mat::create(&local_4b8,w,4,(Allocator *)0x0);
            if (((pointer)local_4b8.data == (pointer)0x0) ||
               (local_4b8.cstep * (long)local_4b8.c == 0)) goto LAB_00175f82;
            pDVar2 = this->d->dr;
            iVar12 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_4b8.data,lVar1);
            lVar14 = CONCAT44(extraout_var_08,iVar12);
            if (lVar14 != lVar1) goto LAB_00175f40;
            piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
            sVar15 = CONCAT44(local_4b8.elemsize._4_4_,(undefined4)local_4b8.elemsize);
          }
          __return_storage_ptr__->data = local_4b8.data;
          __return_storage_ptr__->refcount = piVar16;
          __return_storage_ptr__->elemsize = sVar15;
          __return_storage_ptr__->elempack = local_4b8.elempack;
          __return_storage_ptr__->allocator = local_4b8.allocator;
          __return_storage_ptr__->dims = local_4b8.dims;
          __return_storage_ptr__->w = local_4b8.w;
          __return_storage_ptr__->h = local_4b8.h;
          __return_storage_ptr__->d = local_4b8.d;
          __return_storage_ptr__->c = local_4b8.c;
          __return_storage_ptr__->cstep = local_4b8.cstep;
        }
        else {
          __n = (size_t)w;
          if (flag_struct.tag != 0xd4b38) {
            if (flag_struct.tag == 0x1306b47) {
              refbuf = (void *)0x0;
              __new_size = __n * 2 + 3 & 0xfffffffffffffffc;
              pDVar2 = this->d->dr;
              iVar13 = (*pDVar2->_vptr_DataReader[4])(pDVar2,__new_size);
              iVar9 = local_4b8.d;
              iVar7 = local_4b8.h;
              iVar5 = local_4b8.w;
              iVar12 = local_4b8.dims;
              local_4b8.dims = (int)local_410;
              iVar4 = local_4b8.dims;
              local_4b8.w = SUB84(local_410,4);
              iVar6 = local_4b8.w;
              local_4b8.h = (int)uStack_408;
              iVar8 = local_4b8.h;
              local_4b8.d = SUB84(uStack_408,4);
              iVar10 = local_4b8.d;
              local_4b8.dims = iVar12;
              local_4b8.w = iVar5;
              local_4b8.h = iVar7;
              local_4b8.d = iVar9;
              if (CONCAT44(extraout_var_00,iVar13) == __new_size) {
                Mat::from_float16((Mat *)&int8_weights,(unsigned_short *)refbuf,w);
                if (int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                       *(int *)int8_weights.
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                               .super__Vector_impl_data._M_finish + 1;
                  UNLOCK();
                }
                piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
                if (piVar16 != (int *)0x0) {
                  LOCK();
                  *piVar16 = *piVar16 + -1;
                  UNLOCK();
                  if (*piVar16 == 0) {
                    if (local_4b8.allocator == (Allocator *)0x0) {
                      free(local_4b8.data);
                    }
                    else {
                      (*(local_4b8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_4b8.data =
                     int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_4b8.refcount._0_4_ =
                     SUB84(int8_weights.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish,0);
                local_4b8.refcount._4_4_ =
                     (undefined4)
                     ((ulong)int8_weights.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_finish >> 0x20);
                local_4b8.elemsize._0_4_ =
                     SUB84(int8_weights.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
                local_4b8.elemsize._4_4_ =
                     (undefined4)
                     ((ulong)int8_weights.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage >> 0x20);
                local_4b8.elempack = local_420;
                local_4b8.allocator = local_418;
                local_4b8.c = local_400;
                local_4b8.cstep = local_3f8;
                local_4b8.dims = iVar4;
                local_4b8.w = iVar6;
                local_4b8.h = iVar8;
                local_4b8.d = iVar10;
                if (int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                       *(int *)int8_weights.
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                               .super__Vector_impl_data._M_finish + -1;
                  UNLOCK();
                  if (*(int *)int8_weights.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_finish == 0) {
                    if (local_418 == (Allocator *)0x0) {
                      free(int8_weights.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_start);
                    }
                    else {
                      (*local_418->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              else {
                float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                          (&float16_weights,__new_size);
                pDVar2 = this->d->dr;
                iVar12 = (*pDVar2->_vptr_DataReader[3])
                                   (pDVar2,float16_weights.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data._M_start,__new_size);
                uVar18 = CONCAT44(extraout_var_09,iVar12);
                if (uVar18 == __new_size) {
                  Mat::from_float16((Mat *)&int8_weights,
                                    float16_weights.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start,w);
                  if (int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                    LOCK();
                    *(int *)int8_weights.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                         *(int *)int8_weights.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 1;
                    UNLOCK();
                  }
                  piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + -1;
                    UNLOCK();
                    if (*piVar16 == 0) {
                      if (local_4b8.allocator == (Allocator *)0x0) {
                        free(local_4b8.data);
                      }
                      else {
                        (*(local_4b8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_4b8.data =
                       int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_4b8.refcount._0_4_ =
                       SUB84(int8_weights.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_finish,0);
                  local_4b8.refcount._4_4_ =
                       (undefined4)
                       ((ulong)int8_weights.
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                               .super__Vector_impl_data._M_finish >> 0x20);
                  local_4b8.elemsize._0_4_ =
                       SUB84(int8_weights.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,0);
                  local_4b8.elemsize._4_4_ =
                       (undefined4)
                       ((ulong)int8_weights.
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage >> 0x20);
                  local_4b8.elempack = local_420;
                  local_4b8.allocator = local_418;
                  local_4b8.c = local_400;
                  local_4b8.cstep = local_3f8;
                  local_4b8.dims = iVar4;
                  local_4b8.w = iVar6;
                  local_4b8.h = iVar8;
                  local_4b8.d = iVar10;
                  if (int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                    LOCK();
                    *(int *)int8_weights.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                         *(int *)int8_weights.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -1;
                    UNLOCK();
                    if (*(int *)int8_weights.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish == 0) {
                      if (local_418 == (Allocator *)0x0) {
                        free(int8_weights.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start);
                      }
                      else {
                        (*local_418->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                else {
                  fprintf(_stderr,"ModelBin read float16_weights failed %zd",uVar18);
                  fputc(10,_stderr);
                  __return_storage_ptr__->cstep = 0;
                  __return_storage_ptr__->data = (void *)0x0;
                  __return_storage_ptr__->refcount = (int *)0x0;
                  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                  __return_storage_ptr__->allocator = (Allocator *)0x0;
                  __return_storage_ptr__->dims = 0;
                  __return_storage_ptr__->w = 0;
                  __return_storage_ptr__->w = 0;
                  __return_storage_ptr__->h = 0;
                  __return_storage_ptr__->d = 0;
                  __return_storage_ptr__->c = 0;
                }
                std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                          (&float16_weights.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
LAB_0017631c:
                if (uVar18 != __new_size) goto LAB_0017636b;
              }
            }
            else {
              if ((flag_struct.tag >> 0x10 & 0xff) +
                  (flag_struct.tag >> 8 & 0xff) + (flag_struct.tag & 0xff) != 0 ||
                  flag_struct.tag >> 0x18 != 0) {
                Mat::create(&local_4b8,w,4,(Allocator *)0x0);
                if (((pointer)local_4b8.data == (pointer)0x0) ||
                   (local_4b8.cstep * (long)local_4b8.c == 0)) {
                  __return_storage_ptr__->data = local_4b8.data;
                  goto LAB_00175f85;
                }
                pDVar2 = this->d->dr;
                iVar12 = (*pDVar2->_vptr_DataReader[3])(pDVar2,&int8_weights,0x400);
                lVar14 = CONCAT44(extraout_var_05,iVar12);
                if (lVar14 != 0x400) {
                  __format = "ModelBin read quantization_value failed %zd";
                  goto LAB_00175f51;
                }
                __new_size = __n + 3 & 0xfffffffffffffffc;
                float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&float16_weights
                           ,__new_size);
                pDVar2 = this->d->dr;
                iVar12 = (*pDVar2->_vptr_DataReader[3])
                                   (pDVar2,float16_weights.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data._M_start,__new_size);
                uVar18 = CONCAT44(extraout_var_06,iVar12);
                if (uVar18 == __new_size) {
                  uVar17 = 0;
                  uVar19 = (ulong)(uint)w;
                  if (w < 1) {
                    uVar19 = uVar17;
                  }
                  for (; uVar19 != uVar17; uVar17 = uVar17 + 1) {
                    *(undefined4 *)((long)local_4b8.data + uVar17 * 2 * 2) =
                         *(undefined4 *)
                          ((long)&int8_weights.
                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                          (ulong)*(byte *)((long)float16_weights.
                                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar17)
                          * 4);
                  }
                }
                else {
                  fprintf(_stderr,"ModelBin read index_array failed %zd",uVar18);
                  fputc(10,_stderr);
                  __return_storage_ptr__->cstep = 0;
                  __return_storage_ptr__->data = (void *)0x0;
                  __return_storage_ptr__->refcount = (int *)0x0;
                  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                  __return_storage_ptr__->allocator = (Allocator *)0x0;
                  __return_storage_ptr__->dims = 0;
                  __return_storage_ptr__->w = 0;
                  __return_storage_ptr__->w = 0;
                  __return_storage_ptr__->h = 0;
                  __return_storage_ptr__->d = 0;
                  __return_storage_ptr__->c = 0;
                }
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &float16_weights);
                goto LAB_0017631c;
              }
              if (flag_struct.field_0.f0 == '\0') {
                int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                pDVar2 = this->d->dr;
                lVar1 = __n * 4;
                iVar12 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
                if (CONCAT44(extraout_var_10,iVar12) == lVar1) {
                  puVar3 = (pointer)int8_weights.
                                    super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
                  piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + -1;
                    UNLOCK();
                    if (*piVar16 == 0) {
                      if (local_4b8.allocator == (Allocator *)0x0) {
                        free(local_4b8.data);
                      }
                      else {
                        (*(local_4b8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_4b8.refcount._0_4_ = 0;
                  local_4b8.refcount._4_4_ = 0;
                  local_4b8.elemsize._0_4_ = 4;
                  local_4b8.elemsize._4_4_ = 0;
                  local_4b8.elempack = 1;
                  local_4b8.allocator = (Allocator *)0x0;
                  local_4b8.h = 1;
                  local_4b8.d = 1;
                  local_4b8.data = puVar3;
                  local_4b8.dims = local_4b8.elempack;
                  local_4b8.w = w;
                  local_4b8.c = local_4b8.elempack;
                  local_4b8.cstep = __n;
                }
                else {
                  Mat::create(&local_4b8,w,4,(Allocator *)0x0);
                  if (((pointer)local_4b8.data == (pointer)0x0) ||
                     (local_4b8.cstep * (long)local_4b8.c == 0)) goto LAB_00175f82;
                  pDVar2 = this->d->dr;
                  iVar12 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_4b8.data,lVar1);
                  lVar14 = CONCAT44(extraout_var_11,iVar12);
                  if (lVar14 != lVar1) goto LAB_00175f40;
                }
              }
            }
            __return_storage_ptr__->data = local_4b8.data;
            piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
            __return_storage_ptr__->refcount = piVar16;
            __return_storage_ptr__->elemsize =
                 CONCAT44(local_4b8.elemsize._4_4_,(undefined4)local_4b8.elemsize);
            __return_storage_ptr__->elempack = local_4b8.elempack;
            __return_storage_ptr__->allocator = local_4b8.allocator;
            __return_storage_ptr__->dims = local_4b8.dims;
            __return_storage_ptr__->w = local_4b8.w;
            __return_storage_ptr__->h = local_4b8.h;
            __return_storage_ptr__->d = local_4b8.d;
            __return_storage_ptr__->c = local_4b8.c;
            __return_storage_ptr__->cstep = local_4b8.cstep;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + 1;
              UNLOCK();
            }
            goto LAB_0017636b;
          }
          float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          uVar18 = __n + 3 & 0xfffffffffffffffc;
          iVar12 = (*this->d->dr->_vptr_DataReader[4])();
          puVar3 = float16_weights.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (CONCAT44(extraout_var_03,iVar12) != uVar18) {
            int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<signed_char,_std::allocator<signed_char>_>::resize(&int8_weights,uVar18);
            pDVar2 = this->d->dr;
            iVar12 = (*pDVar2->_vptr_DataReader[3])
                               (pDVar2,int8_weights.
                                       super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,uVar18);
            if (CONCAT44(extraout_var_07,iVar12) == uVar18) {
              Mat::create(&local_4b8,w,1,(Allocator *)0x0);
              if (((pointer)local_4b8.data != (pointer)0x0) &&
                 (local_4b8.cstep * (long)local_4b8.c != 0)) {
                memcpy(local_4b8.data,
                       int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,__n);
                std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                          (&int8_weights.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>);
                piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
                sVar15 = CONCAT44(local_4b8.elemsize._4_4_,(undefined4)local_4b8.elemsize);
                goto LAB_0017602f;
              }
              __return_storage_ptr__->data = local_4b8.data;
              piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
              __return_storage_ptr__->refcount = piVar16;
              __return_storage_ptr__->elemsize =
                   CONCAT44(local_4b8.elemsize._4_4_,(undefined4)local_4b8.elemsize);
              __return_storage_ptr__->elempack = local_4b8.elempack;
              __return_storage_ptr__->allocator = local_4b8.allocator;
              __return_storage_ptr__->dims = local_4b8.dims;
              __return_storage_ptr__->w = local_4b8.w;
              __return_storage_ptr__->h = local_4b8.h;
              __return_storage_ptr__->d = local_4b8.d;
              __return_storage_ptr__->c = local_4b8.c;
              __return_storage_ptr__->cstep = local_4b8.cstep;
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + 1;
                UNLOCK();
              }
            }
            else {
              fprintf(_stderr,"ModelBin read int8_weights failed %zd",
                      CONCAT44(extraout_var_07,iVar12));
              fputc(10,_stderr);
              __return_storage_ptr__->cstep = 0;
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 0;
              __return_storage_ptr__->d = 0;
              __return_storage_ptr__->c = 0;
            }
            std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                      (&int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
            goto LAB_0017636b;
          }
          piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (local_4b8.allocator == (Allocator *)0x0) {
                free(local_4b8.data);
              }
              else {
                (*(local_4b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_4b8.data = puVar3;
          local_4b8.refcount._0_4_ = 0;
          local_4b8.refcount._4_4_ = 0;
          local_4b8.elemsize._0_4_ = 1;
          local_4b8.elemsize._4_4_ = 0;
          local_4b8.elempack = 1;
          local_4b8.allocator = (Allocator *)0x0;
          local_4b8.h = 1;
          local_4b8.d = 1;
          sVar15 = 1;
          piVar16 = (int *)0x0;
          local_4b8.dims = local_4b8.elempack;
          local_4b8.w = w;
          local_4b8.c = local_4b8.elempack;
          local_4b8.cstep = __n;
LAB_0017602f:
          __return_storage_ptr__->data = local_4b8.data;
          __return_storage_ptr__->refcount = piVar16;
          __return_storage_ptr__->elemsize = sVar15;
          __return_storage_ptr__->elempack = local_4b8.elempack;
          __return_storage_ptr__->allocator = local_4b8.allocator;
          __return_storage_ptr__->dims = local_4b8.dims;
          __return_storage_ptr__->w = local_4b8.w;
          __return_storage_ptr__->h = local_4b8.h;
          __return_storage_ptr__->d = local_4b8.d;
          __return_storage_ptr__->c = local_4b8.c;
          __return_storage_ptr__->cstep = local_4b8.cstep;
        }
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        goto LAB_0017636b;
      }
      __format = "ModelBin read flag_struct failed %zd";
LAB_00175f51:
      fprintf(_stderr,__format,lVar14);
    }
    else {
      fprintf(_stderr,"ModelBin load type %d not implemented",(ulong)(uint)type);
    }
    fputc(10,_stderr);
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->d = 0;
    __return_storage_ptr__->c = 0;
    goto LAB_0017636b;
  }
  int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar1 = (long)w * 4;
  iVar12 = (*this->d->dr->_vptr_DataReader[4])();
  pcVar11 = int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (CONCAT44(extraout_var_01,iVar12) == lVar1) {
    piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_4b8.allocator == (Allocator *)0x0) {
          free(local_4b8.data);
        }
        else {
          (*(local_4b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_4b8.data = pcVar11;
    local_4b8.refcount._0_4_ = 0;
    local_4b8.refcount._4_4_ = 0;
    sVar15 = 4;
    local_4b8.elemsize._0_4_ = 4;
    local_4b8.elemsize._4_4_ = 0;
    local_4b8.elempack = 1;
    local_4b8.allocator = (Allocator *)0x0;
    local_4b8.h = 1;
    local_4b8.d = 1;
    piVar16 = (int *)0x0;
    local_4b8.dims = local_4b8.elempack;
    local_4b8.w = w;
    local_4b8.c = local_4b8.elempack;
    local_4b8.cstep = (long)w;
LAB_00175e86:
    __return_storage_ptr__->data = local_4b8.data;
    __return_storage_ptr__->refcount = piVar16;
    __return_storage_ptr__->elemsize = sVar15;
    __return_storage_ptr__->elempack = local_4b8.elempack;
    __return_storage_ptr__->allocator = local_4b8.allocator;
    __return_storage_ptr__->dims = local_4b8.dims;
    __return_storage_ptr__->w = local_4b8.w;
    __return_storage_ptr__->h = local_4b8.h;
    __return_storage_ptr__->d = local_4b8.d;
    __return_storage_ptr__->c = local_4b8.c;
    __return_storage_ptr__->cstep = local_4b8.cstep;
  }
  else {
    Mat::create(&local_4b8,w,4,(Allocator *)0x0);
    if (((pointer)local_4b8.data != (pointer)0x0) && (local_4b8.cstep * (long)local_4b8.c != 0)) {
      pDVar2 = this->d->dr;
      iVar12 = (*pDVar2->_vptr_DataReader[3])(pDVar2,local_4b8.data,lVar1);
      lVar14 = CONCAT44(extraout_var_02,iVar12);
      if (lVar14 != lVar1) {
LAB_00175f40:
        __format = "ModelBin read weight_data failed %zd";
        goto LAB_00175f51;
      }
      piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
      sVar15 = CONCAT44(local_4b8.elemsize._4_4_,(undefined4)local_4b8.elemsize);
      goto LAB_00175e86;
    }
LAB_00175f82:
    __return_storage_ptr__->data = local_4b8.data;
LAB_00175f85:
    piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
    __return_storage_ptr__->refcount = piVar16;
    __return_storage_ptr__->elemsize =
         CONCAT44(local_4b8.elemsize._4_4_,(undefined4)local_4b8.elemsize);
    __return_storage_ptr__->elempack = local_4b8.elempack;
    __return_storage_ptr__->allocator = local_4b8.allocator;
    __return_storage_ptr__->dims = local_4b8.dims;
    __return_storage_ptr__->w = local_4b8.w;
    __return_storage_ptr__->h = local_4b8.h;
    __return_storage_ptr__->d = local_4b8.d;
    __return_storage_ptr__->c = local_4b8.c;
    __return_storage_ptr__->cstep = local_4b8.cstep;
  }
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + 1;
    UNLOCK();
  }
LAB_0017636b:
  piVar16 = (int *)CONCAT44(local_4b8.refcount._4_4_,local_4b8.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_4b8.allocator == (Allocator *)0x0) {
        free(local_4b8.data);
      }
      else {
        (*(local_4b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    Mat m;

    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = d->dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat::from_float16((const unsigned short*)refbuf, w);
            }
            else
            {
                std::vector<unsigned short> float16_weights;
                float16_weights.resize(align_data_size);
                nread = d->dr.read(&float16_weights[0], align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                    return Mat();
                }

                m = Mat::from_float16(&float16_weights[0], w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat(w, (void*)refbuf, (size_t)1u);
            }
            else
            {
                std::vector<signed char> int8_weights;
                int8_weights.resize(align_data_size);
                nread = d->dr.read(&int8_weights[0], align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                    return Mat();
                }

                m.create(w, (size_t)1u);
                if (m.empty())
                    return m;

                memcpy(m.data, &int8_weights[0], w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data with extra scaling
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }

            return m;
        }

        if (flag != 0)
        {
            m.create(w);
            if (m.empty())
                return m;

            // quantized data
            float quantization_value[256];
            nread = d->dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = d->dr.read(&index_array[0], align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[index_array[i]];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }
        }

        return m;
    }
    else if (type == 1)
    {
        // try reference data
        const void* refbuf = 0;
        size_t nread = d->dr.reference(w * sizeof(float), &refbuf);
        if (nread == w * sizeof(float))
        {
            m = Mat(w, (void*)refbuf);
        }
        else
        {
            m.create(w);
            if (m.empty())
                return m;

            // raw data
            size_t nread = d->dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}